

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

bool __thiscall dmlc::JSONReader::NextObjectItem(JSONReader *this,string *out_key)

{
  pointer *ppuVar1;
  pointer puVar2;
  int iVar3;
  ostream *poVar4;
  int ch;
  LogCheckError _check_err;
  string local_1c0;
  LogMessageFatal local_1a0;
  
  if ((this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] == 0) {
    iVar3 = PeekNextNonSpace(this);
    if (iVar3 == 0x7d) {
      NextChar(this);
      goto LAB_00111971;
    }
  }
  else {
    ch = NextNonSpace(this);
    if ((ch == -1) || (ch == 0x7d)) {
LAB_00111971:
      ppuVar1 = &(this->scope_counter_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
      return false;
    }
    local_1a0.log_stream_ = (ostringstream)0x2c;
    LogCheck_EQ<int,char>((dmlc *)&_check_err,&ch,(char *)&local_1a0);
    if (_check_err.str != (string *)0x0) {
      LogMessageFatal::LogMessageFatal
                (&local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x305);
      poVar4 = std::operator<<((ostream *)&local_1a0,"Check failed: ");
      poVar4 = std::operator<<(poVar4,"ch == \',\'");
      poVar4 = std::operator<<(poVar4,(string *)_check_err.str);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,"Error at");
      line_info_abi_cxx11_(&local_1c0,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_1c0);
      poVar4 = std::operator<<(poVar4,", JSON object expect \'}\' or \',\' \'");
      poVar4 = std::operator<<(poVar4,(char)ch);
      std::operator<<(poVar4,'\'');
      std::__cxx11::string::~string((string *)&local_1c0);
      LogMessageFatal::~LogMessageFatal(&local_1a0);
    }
    LogCheckError::~LogCheckError(&_check_err);
  }
  puVar2 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar2 = *puVar2 + 1;
  ReadString(this,out_key);
  ch = NextNonSpace(this);
  local_1a0.log_stream_ = (ostringstream)0x3a;
  LogCheck_EQ<int,char>((dmlc *)&_check_err,&ch,(char *)&local_1a0);
  if (_check_err.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x317);
    poVar4 = std::operator<<((ostream *)&local_1a0,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"ch == \':\'");
    poVar4 = std::operator<<(poVar4,(string *)_check_err.str);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Error at");
    line_info_abi_cxx11_(&local_1c0,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1c0);
    poVar4 = std::operator<<(poVar4,", Expect \':\' but get \'");
    poVar4 = std::operator<<(poVar4,(char)ch);
    std::operator<<(poVar4,'\'');
    std::__cxx11::string::~string((string *)&local_1c0);
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  LogCheckError::~LogCheckError(&_check_err);
  return true;
}

Assistant:

inline bool JSONReader::NextObjectItem(std::string *out_key) {
  bool next = true;
  if (scope_counter_.back() != 0) {
    int ch = NextNonSpace();
    if (ch == EOF) {
      next = false;
    } else if (ch == '}') {
      next = false;
    } else {
      CHECK_EQ(ch, ',')
          << "Error at" << line_info()
          << ", JSON object expect \'}\' or \',\' \'" << static_cast<char>(ch) << '\'';
    }
  } else {
    int ch = PeekNextNonSpace();
    if (ch == '}') {
      NextChar();
      next = false;
    }
  }
  if (!next) {
    scope_counter_.pop_back();
    return false;
  } else {
    scope_counter_.back() += 1;
    ReadString(out_key);
    int ch = NextNonSpace();
    CHECK_EQ(ch, ':')
        << "Error at" << line_info()
        << ", Expect \':\' but get \'" << static_cast<char>(ch) << '\'';
    return true;
  }
}